

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O2

char * mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::GetTypeName(void)

{
  int iVar1;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()::name_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::
                                 GetTypeName()::name_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"AlgebraicConstraint< ",&local_a9);
      std::operator+(&local_68,&local_88,"QuadAndLinTerms");
      std::operator+(&local_48,&local_68,", ");
      AlgConRhs<1>::GetTypeName_abi_cxx11_();
      std::operator+(&local_28,&local_48,&local_a8);
      std::operator+(&AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()::
                      name_abi_cxx11_,&local_28," >");
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      __cxa_atexit(std::__cxx11::string::~string,
                   &AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()::
                    name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()
                           ::name_abi_cxx11_);
    }
  }
  return AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()::name_abi_cxx11_.
         _M_dataplus._M_p;
}

Assistant:

static const char* GetTypeName() {
    static std::string name {
      std::string("AlgebraicConstraint< ") +
      Body::GetTypeName() + ", " +
      RhsOrRange::GetTypeName() + " >" };
    return name.c_str();
  }